

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void fs_print_error(string_view path1,string_view path2,string_view fname,error_code *ec)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  string local_88;
  char *local_68;
  char *local_60;
  size_t local_58;
  char *local_50;
  size_t local_48;
  size_t local_40;
  size_t local_38;
  string_view fname_local;
  string_view path2_local;
  string_view path1_local;
  
  fname_local._M_len = (size_t)fname._M_str;
  local_38 = fname._M_len;
  fname_local._M_str = (char *)path2._M_len;
  poVar3 = std::operator<<((ostream *)&std::cerr,"ERROR: Ffilesystem:");
  local_48 = local_38;
  local_40 = fname_local._M_len;
  __str_00._M_str = (char *)fname_local._M_len;
  __str_00._M_len = local_38;
  pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar3,__str_00);
  poVar3 = std::operator<<((ostream *)pbVar4,"(");
  local_58 = path1._M_len;
  local_50 = path1._M_str;
  pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar3,path1);
  poVar3 = std::operator<<((ostream *)pbVar4,", ");
  local_68 = fname_local._M_str;
  __str._M_str = path2._M_str;
  __str._M_len = (size_t)fname_local._M_str;
  local_60 = path2._M_str;
  pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar3,__str);
  std::operator<<((ostream *)pbVar4,")  ");
  bVar1 = std::error_code::operator_cast_to_bool(ec);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"C++ exception:");
    std::error_code::message_abi_cxx11_(&local_88,ec);
    poVar3 = std::operator<<(poVar3,(string *)&local_88);
    poVar3 = std::operator<<(poVar3," ");
    iVar2 = std::error_code::value(ec);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3," ");
    std::__cxx11::string::~string((string *)&local_88);
  }
  fs_emit_error();
  std::ostream::operator<<((ostream *)&std::cerr,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void fs_print_error(std::string_view path1, std::string_view path2, std::string_view fname, const std::error_code& ec)
{
  std::cerr << "ERROR: Ffilesystem:" << fname << "(" << path1 <<  ", " << path2 << ")  ";

  if(ec)
    std::cerr << "C++ exception:" << ec.message() <<  " " << ec.value() << " ";

  fs_emit_error();

  std::cerr << std::endl;
}